

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

EnumValueOptions *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::EnumValueOptions>(Arena *arena)

{
  EnumValueOptions *this;
  
  if (arena == (Arena *)0x0) {
    this = (EnumValueOptions *)operator_new(0x50);
    EnumValueOptions::EnumValueOptions(this,(Arena *)0x0);
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&EnumValueOptions::typeinfo,0x50);
    }
    this = (EnumValueOptions *)AllocateAlignedNoHook(arena,0x50);
    EnumValueOptions::EnumValueOptions(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::EnumValueOptions* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::EnumValueOptions >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::EnumValueOptions >(arena);
}